

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

bool __thiscall Engine::propagate(Engine *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  vec<Propagator_*> *pvVar4;
  Propagator **ppPVar5;
  SAT *in_RDI;
  bool ok;
  Propagator *p;
  int i_1;
  uint i;
  SAT *in_stack_00000120;
  IntVar *in_stack_ffffffffffffffe0;
  uint local_18;
  uint local_14;
  
  if (((in_RDI->trail).sz & 1) == 0) {
    (in_RDI->num_used).data = (int *)0x0;
    do {
      bVar1 = SAT::consistent(in_RDI);
      if ((!bVar1) && (bVar1 = SAT::propagate(in_stack_00000120), !bVar1)) {
        return false;
      }
      local_14 = 0;
      while (uVar3 = local_14, uVar2 = vec<IntVar_*>::size((vec<IntVar_*> *)&in_RDI->orig_cutoff),
            uVar3 < uVar2) {
        vec<IntVar_*>::operator[]((vec<IntVar_*> *)&in_RDI->orig_cutoff,local_14);
        IntVar::wakePropagators(in_stack_ffffffffffffffe0);
        local_14 = local_14 + 1;
      }
      vec<IntVar_*>::clear((vec<IntVar_*> *)in_RDI,SUB41(uVar3 >> 0x18,0));
      if (sat.confl != (Clause *)0x0) {
        return false;
      }
      (in_RDI->num_used).data = (int *)0x0;
      local_18 = 0;
      while( true ) {
        if (5 < (int)local_18) {
          return true;
        }
        pvVar4 = vec<vec<Propagator_*>_>::operator[]
                           ((vec<vec<Propagator_*>_> *)&(in_RDI->var_free_list).data,local_18);
        uVar3 = vec<Propagator_*>::size(pvVar4);
        if (uVar3 != 0) break;
        local_18 = local_18 + 1;
      }
      pvVar4 = vec<vec<Propagator_*>_>::operator[]
                         ((vec<vec<Propagator_*>_> *)&(in_RDI->var_free_list).data,local_18);
      ppPVar5 = vec<Propagator_*>::last(pvVar4);
      in_stack_ffffffffffffffe0 = (IntVar *)*ppPVar5;
      pvVar4 = vec<vec<Propagator_*>_>::operator[]
                         ((vec<vec<Propagator_*>_> *)&(in_RDI->var_free_list).data,local_18);
      vec<Propagator_*>::pop(pvVar4);
      (in_RDI->seen).data = (in_RDI->seen).data + 1;
      uVar3 = (*(in_stack_ffffffffffffffe0->super_Var).super_Branching._vptr_Branching[3])();
      (*(in_stack_ffffffffffffffe0->super_Var).super_Branching._vptr_Branching[4])();
    } while ((uVar3 & 1) != 0);
  }
  else {
    *(undefined1 *)&(in_RDI->trail).sz = 0;
  }
  return false;
}

Assistant:

bool Engine::propagate() {
	if (async_fail) {
		async_fail = false;
		assert(!so.lazy || sat.confl);
		return false;
	}

	last_prop = nullptr;

WakeUp:

	if (!sat.consistent() && !sat.propagate()) {
		return false;
	}

	for (unsigned int i = 0; i < v_queue.size(); i++) {
		v_queue[i]->wakePropagators();
	}
	v_queue.clear();

	if (sat.confl != nullptr) {
		return false;
	}

	last_prop = nullptr;

	for (int i = 0; i < num_queues; i++) {
		if (p_queue[i].size() != 0) {
			Propagator* p = p_queue[i].last();
			p_queue[i].pop();
			propagations++;
			const bool ok = p->propagate();
			p->clearPropState();
			if (!ok) {
				return false;
			}
			goto WakeUp;
		}
	}

	return true;
}